

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O2

void __thiscall crnlib::qdxt1::cluster_id::set(cluster_id *this,vector<unsigned_int> *indices)

{
  uint *puVar1;
  uint32 uVar2;
  uint i;
  ulong uVar3;
  
  vector<unsigned_int>::resize(&this->m_cells,indices->m_size,false);
  for (uVar3 = 0; uVar3 < indices->m_size; uVar3 = uVar3 + 1) {
    (this->m_cells).m_p[uVar3] = indices->m_p[uVar3];
  }
  puVar1 = (this->m_cells).m_p;
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
            (puVar1,puVar1 + (this->m_cells).m_size);
  uVar2 = fast_hash((this->m_cells).m_p,(this->m_cells).m_size << 2);
  this->m_hash = (ulong)uVar2;
  return;
}

Assistant:

void set(const crnlib::vector<uint>& indices) {
      m_cells.resize(indices.size());

      for (uint i = 0; i < indices.size(); i++)
        m_cells[i] = static_cast<uint32>(indices[i]);

      std::sort(m_cells.begin(), m_cells.end());

      m_hash = fast_hash(&m_cells[0], sizeof(m_cells[0]) * m_cells.size());
    }